

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::sampleLinear2D(tcu *this,ConstPixelBufferAccess *access,Sampler *sampler,float u,float v,
                   IVec3 *offset)

{
  bool bVar1;
  int iVar2;
  int size;
  deInt32 dVar3;
  int iVar4;
  deInt32 dVar5;
  int iVar6;
  int x;
  int x_00;
  TextureFormat *pTVar7;
  float s;
  float s_00;
  Vector<float,_4> VVar8;
  Vec4 VVar9;
  byte local_163;
  byte local_162;
  byte local_161;
  byte local_145;
  Vector<float,_4> local_144;
  Vector<float,_4> local_134;
  Vector<float,_4> local_124;
  Vector<float,_4> local_114;
  Vector<float,_4> local_104;
  Vector<float,_4> local_f4;
  Vector<float,_4> local_e4;
  Vector<float,_4> local_d4;
  Vector<float,_4> local_c4;
  Vector<float,_4> local_b4;
  undefined1 local_a4 [8];
  Vec4 p11;
  Vec4 p01;
  Vec4 p10;
  Vec4 p00;
  bool j1UseBorder;
  bool j0UseBorder;
  bool i1UseBorder;
  bool i0UseBorder;
  float b;
  float a;
  int j1;
  int j0;
  int i1;
  int i0;
  int y1;
  int y0;
  int x1;
  int x0;
  int h;
  int w;
  IVec3 *offset_local;
  float v_local;
  float u_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *access_local;
  
  iVar2 = ConstPixelBufferAccess::getWidth(access);
  size = ConstPixelBufferAccess::getHeight(access);
  dVar3 = ::deFloorFloatToInt32(u - 0.5);
  iVar4 = Vector<int,_3>::x(offset);
  dVar5 = ::deFloorFloatToInt32(v - 0.5);
  iVar6 = Vector<int,_3>::y(offset);
  x = wrap(sampler->wrapS,dVar3 + iVar4,iVar2);
  iVar4 = wrap(sampler->wrapS,dVar3 + iVar4 + 1,iVar2);
  x_00 = wrap(sampler->wrapT,dVar5 + iVar6,size);
  iVar6 = wrap(sampler->wrapT,dVar5 + iVar6 + 1,size);
  s = deFloatFrac(u - 0.5);
  s_00 = deFloatFrac(v - 0.5);
  local_145 = 0;
  if (sampler->wrapS == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(x,0,iVar2);
    local_145 = bVar1 ^ 0xff;
  }
  local_161 = 0;
  if (sampler->wrapS == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(iVar4,0,iVar2);
    local_161 = bVar1 ^ 0xff;
  }
  local_162 = 0;
  if (sampler->wrapT == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(x_00,0,size);
    local_162 = bVar1 ^ 0xff;
  }
  local_163 = 0;
  if (sampler->wrapT == CLAMP_TO_BORDER) {
    bVar1 = de::inBounds<int>(iVar6,0,size);
    local_163 = bVar1 ^ 0xff;
  }
  if (((local_145 & 1) == 0) && ((local_162 & 1) == 0)) {
    iVar2 = Vector<int,_3>::z(offset);
    lookup((tcu *)(p10.m_data + 2),access,x,x_00,iVar2);
  }
  else {
    pTVar7 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p10.m_data + 2),pTVar7,sampler);
  }
  if (((local_161 & 1) == 0) && ((local_162 & 1) == 0)) {
    iVar2 = Vector<int,_3>::z(offset);
    lookup((tcu *)(p01.m_data + 2),access,iVar4,x_00,iVar2);
  }
  else {
    pTVar7 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p01.m_data + 2),pTVar7,sampler);
  }
  if (((local_145 & 1) == 0) && ((local_163 & 1) == 0)) {
    iVar2 = Vector<int,_3>::z(offset);
    lookup((tcu *)(p11.m_data + 2),access,x,iVar6,iVar2);
  }
  else {
    pTVar7 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)(p11.m_data + 2),pTVar7,sampler);
  }
  if (((local_161 & 1) == 0) && ((local_163 & 1) == 0)) {
    iVar2 = Vector<int,_3>::z(offset);
    lookup((tcu *)local_a4,access,iVar4,iVar6,iVar2);
  }
  else {
    pTVar7 = ConstPixelBufferAccess::getFormat(access);
    lookupBorder((tcu *)local_a4,pTVar7,sampler);
  }
  operator*((tcu *)&local_e4,(Vector<float,_4> *)(p10.m_data + 2),1.0 - s);
  operator*((tcu *)&local_d4,&local_e4,1.0 - s_00);
  operator*((tcu *)&local_104,(Vector<float,_4> *)(p01.m_data + 2),s);
  operator*((tcu *)&local_f4,&local_104,1.0 - s_00);
  operator+((tcu *)&local_c4,&local_d4,&local_f4);
  operator*((tcu *)&local_124,(Vector<float,_4> *)(p11.m_data + 2),1.0 - s);
  operator*((tcu *)&local_114,&local_124,s_00);
  operator+((tcu *)&local_b4,&local_c4,&local_114);
  operator*((tcu *)&local_144,(Vector<float,_4> *)local_a4,s);
  operator*((tcu *)&local_134,&local_144,s_00);
  VVar8 = operator+(this,&local_b4,&local_134);
  VVar9.m_data[0] = VVar8.m_data[0];
  VVar9.m_data[1] = VVar8.m_data[1];
  VVar9.m_data[2] = VVar8.m_data[2];
  VVar9.m_data[3] = VVar8.m_data[3];
  return (Vec4)VVar9.m_data;
}

Assistant:

static Vec4 sampleLinear2D (const ConstPixelBufferAccess& access, const Sampler& sampler, float u, float v, const IVec3& offset)
{
	int w = access.getWidth();
	int h = access.getHeight();

	int x0 = deFloorFloatToInt32(u-0.5f)+offset.x();
	int x1 = x0+1;
	int y0 = deFloorFloatToInt32(v-0.5f)+offset.y();
	int y1 = y0+1;

	int i0 = wrap(sampler.wrapS, x0, w);
	int i1 = wrap(sampler.wrapS, x1, w);
	int j0 = wrap(sampler.wrapT, y0, h);
	int j1 = wrap(sampler.wrapT, y1, h);

	float a = deFloatFrac(u-0.5f);
	float b = deFloatFrac(v-0.5f);

	bool i0UseBorder = sampler.wrapS == Sampler::CLAMP_TO_BORDER && !de::inBounds(i0, 0, w);
	bool i1UseBorder = sampler.wrapS == Sampler::CLAMP_TO_BORDER && !de::inBounds(i1, 0, w);
	bool j0UseBorder = sampler.wrapT == Sampler::CLAMP_TO_BORDER && !de::inBounds(j0, 0, h);
	bool j1UseBorder = sampler.wrapT == Sampler::CLAMP_TO_BORDER && !de::inBounds(j1, 0, h);

	// Border color for out-of-range coordinates if using CLAMP_TO_BORDER, otherwise execute lookups.
	Vec4 p00 = (i0UseBorder || j0UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i0, j0, offset.z());
	Vec4 p10 = (i1UseBorder || j0UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i1, j0, offset.z());
	Vec4 p01 = (i0UseBorder || j1UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i0, j1, offset.z());
	Vec4 p11 = (i1UseBorder || j1UseBorder) ? lookupBorder(access.getFormat(), sampler) : lookup(access, i1, j1, offset.z());

	// Interpolate.
	return (p00*(1.0f-a)*(1.0f-b)) +
		   (p10*(     a)*(1.0f-b)) +
		   (p01*(1.0f-a)*(     b)) +
		   (p11*(     a)*(     b));
}